

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

TIntermTyped * __thiscall
glslang::TParseContext::handleLengthMethod
          (TParseContext *this,TSourceLoc *loc,TFunction *function,TIntermNode *intermNode)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TType *type;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_00;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  TIntermTyped *pTVar5;
  TIntermConstantUnion *pTVar6;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined8 uVar7;
  uint uVar8;
  TParseContext *this_01;
  TIntermediate *this_02;
  char *pcVar9;
  _func_int **pp_Var10;
  TType local_c8;
  
  iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
  if (0 < iVar3) {
    iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
    iVar3 = 0;
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"method does not accept any arguments",
               *(undefined8 *)(CONCAT44(extraout_var,iVar4) + 8),"");
    goto LAB_0042168b;
  }
  iVar3 = (*intermNode->_vptr_TIntermNode[3])(intermNode);
  type = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0xf0))
                            ((long *)CONCAT44(extraout_var_00,iVar3));
  iVar3 = (*type->_vptr_TType[0x1d])(type);
  if ((char)iVar3 == '\0') {
    iVar3 = (*type->_vptr_TType[0x1c])(type);
    if ((char)iVar3 == '\0') {
      iVar3 = (*type->_vptr_TType[0x1b])(type);
      if ((char)iVar3 == '\0') {
        if ((*(ushort *)&type->field_0xa & 0x860) == 0) {
          iVar3 = 0;
          iVar4 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,loc,".length()","unexpected use of .length()","");
          pTVar5 = (TIntermTyped *)CONCAT44(extraout_var_16,iVar4);
          goto LAB_0042161c;
        }
        this_02 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        TType::TType(&local_c8,EbtInt,EvqTemporary,1,0,0,false);
LAB_0042166b:
        pTVar5 = TIntermediate::addBuiltInFunctionCall
                           (this_02,loc,EOpArrayLength,true,intermNode,&local_c8);
        goto LAB_00421680;
      }
      iVar3 = (*type->_vptr_TType[0xc])(type);
      pTVar5 = (TIntermTyped *)CONCAT44(extraout_var_09,iVar3);
    }
    else {
      iVar3 = (*type->_vptr_TType[0xd])(type);
      pTVar5 = (TIntermTyped *)CONCAT44(extraout_var_06,iVar3);
    }
LAB_00421618:
    iVar3 = (int)pTVar5;
LAB_0042161c:
    bVar2 = true;
  }
  else {
    iVar3 = (*type->_vptr_TType[0x1f])();
    if ((char)iVar3 != '\0') {
      iVar3 = (*intermNode->_vptr_TIntermNode[0xc])(intermNode);
      if ((CONCAT44(extraout_var_01,iVar3) == 0) || (bVar2 = isIoResizeArray(this,type), !bVar2)) {
        iVar3 = (*intermNode->_vptr_TIntermNode[3])(intermNode);
        pTVar5 = (TIntermTyped *)CONCAT44(extraout_var_10,iVar3);
        iVar3 = 0;
        if (pTVar5 != (TIntermTyped *)0x0) {
          iVar4 = (*(pTVar5->super_TIntermNode)._vptr_TIntermNode[0x21])(pTVar5);
          pTVar5 = (TIntermTyped *)CONCAT44(extraout_var_11,iVar4);
          if ((*(uint *)&(pTVar5->super_TIntermNode).loc.name & 0xff80) == 0x2380) {
            TParseVersions::requireProfile
                      ((TParseVersions *)this,loc,8,
                       "the array size of gl_SampleMask and gl_SampleMaskIn is ceil(gl_MaxSamples/32)"
                      );
            iVar3 = (this->resources).maxSamples;
            uVar1 = iVar3 + 0x1f;
            pTVar5 = (TIntermTyped *)(ulong)uVar1;
            uVar8 = iVar3 + 0x3e;
            if (-1 < (int)uVar1) {
              uVar8 = uVar1;
            }
            iVar3 = (int)uVar8 >> 5;
          }
        }
      }
      else {
        iVar3 = (*intermNode->_vptr_TIntermNode[0xc])(intermNode);
        this_00 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 400))
                            ((long *)CONCAT44(extraout_var_02,iVar3));
        iVar3 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (this_00,"gl_in");
        if (((iVar3 != 0) &&
            (iVar3 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                     compare(this_00,"gl_out"), iVar3 != 0)) &&
           (iVar3 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    compare(this_00,"gl_MeshVerticesNV"), iVar3 != 0)) {
          iVar4 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(this_00,"gl_MeshPrimitivesNV");
          pTVar5 = (TIntermTyped *)CONCAT44(extraout_var_03,iVar4);
          iVar3 = 0;
          if (iVar4 != 0) goto LAB_00421582;
        }
        iVar3 = (*type->_vptr_TType[0xb])(type);
        iVar3 = getIoArrayImplicitSize
                          (this,(TQualifier *)CONCAT44(extraout_var_04,iVar3),(TString *)0x0);
        pTVar5 = (TIntermTyped *)CONCAT44(extraout_var_05,iVar3);
      }
LAB_00421582:
      if (iVar3 == 0) {
        iVar3 = (*intermNode->_vptr_TIntermNode[0xc])(intermNode);
        if ((CONCAT44(extraout_var_12,iVar3) == 0) || (bVar2 = isIoResizeArray(this,type), !bVar2))
        {
          this_01 = (TParseContext *)intermNode;
          iVar3 = (*intermNode->_vptr_TIntermNode[3])();
          bVar2 = isRuntimeLength(this_01,(TIntermTyped *)CONCAT44(extraout_var_15,iVar3));
          if (bVar2) {
            this_02 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            TType::TType(&local_c8,EbtInt,EvqTemporary,1,0,0,false);
            goto LAB_0042166b;
          }
          iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
          uVar7 = *(undefined8 *)(CONCAT44(extraout_var_17,iVar3) + 8);
          pp_Var10 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar9 = "array must be declared with a size before using this method";
        }
        else {
          iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
          uVar7 = *(undefined8 *)(CONCAT44(extraout_var_13,iVar3) + 8);
          pp_Var10 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar9 = "array must first be sized by a redeclaration or layout qualifier";
        }
        iVar3 = 0;
        iVar4 = (*pp_Var10[0x2d])(this,loc,"",uVar7,pcVar9);
        pTVar5 = (TIntermTyped *)CONCAT44(extraout_var_18,iVar4);
      }
      goto LAB_0042161c;
    }
    iVar3 = (*type->_vptr_TType[0x10])(type);
    if (CONCAT44(extraout_var_07,iVar3) == 0) {
      iVar3 = (*type->_vptr_TType[0xf])(type);
      pTVar5 = (TIntermTyped *)CONCAT44(extraout_var_14,iVar3);
      goto LAB_00421618;
    }
    iVar3 = (*type->_vptr_TType[0x10])();
    pTVar5 = (TIntermTyped *)CONCAT44(extraout_var_08,iVar3);
LAB_00421680:
    iVar3 = 0;
    bVar2 = false;
  }
  if (!bVar2) {
    return pTVar5;
  }
LAB_0042168b:
  pTVar6 = TIntermediate::addConstantUnion
                     ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                      iVar3 + (uint)(iVar3 == 0),loc,false);
  return &pTVar6->super_TIntermTyped;
}

Assistant:

TIntermTyped* TParseContext::handleLengthMethod(const TSourceLoc& loc, TFunction* function, TIntermNode* intermNode)
{
    int length = 0;

    if (function->getParamCount() > 0)
        error(loc, "method does not accept any arguments", function->getName().c_str(), "");
    else {
        const TType& type = intermNode->getAsTyped()->getType();
        if (type.isArray()) {
            if (type.isUnsizedArray()) {
                if (intermNode->getAsSymbolNode() && isIoResizeArray(type)) {
                    // We could be between a layout declaration that gives a built-in io array implicit size and
                    // a user redeclaration of that array, meaning we have to substitute its implicit size here
                    // without actually redeclaring the array.  (It is an error to use a member before the
                    // redeclaration, but not an error to use the array name itself.)
                    const TString& name = intermNode->getAsSymbolNode()->getName();
                    if (name == "gl_in" || name == "gl_out" || name == "gl_MeshVerticesNV" ||
                        name == "gl_MeshPrimitivesNV") {
                        length = getIoArrayImplicitSize(type.getQualifier());
                    }
                } else if (const auto typed = intermNode->getAsTyped()) {
                    if (typed->getQualifier().builtIn == EbvSampleMask) {
                        requireProfile(loc, EEsProfile, "the array size of gl_SampleMask and gl_SampleMaskIn is ceil(gl_MaxSamples/32)");
                        length = (resources.maxSamples + 31) / 32;
                    }
                }
                if (length == 0) {
                    if (intermNode->getAsSymbolNode() && isIoResizeArray(type))
                        error(loc, "", function->getName().c_str(), "array must first be sized by a redeclaration or layout qualifier");
                    else if (isRuntimeLength(*intermNode->getAsTyped())) {
                        // Create a unary op and let the back end handle it
                        return intermediate.addBuiltInFunctionCall(loc, EOpArrayLength, true, intermNode, TType(EbtInt));
                    } else
                        error(loc, "", function->getName().c_str(), "array must be declared with a size before using this method");
                }
            } else if (type.getOuterArrayNode()) {
                // If the array's outer size is specified by an intermediate node, it means the array's length
                // was specified by a specialization constant. In such a case, we should return the node of the
                // specialization constants to represent the length.
                return type.getOuterArrayNode();
            } else
                length = type.getOuterArraySize();
        } else if (type.isMatrix())
            length = type.getMatrixCols();
        else if (type.isVector())
            length = type.getVectorSize();
        else if (type.isCoopMat() || type.isCoopVecNV())
            return intermediate.addBuiltInFunctionCall(loc, EOpArrayLength, true, intermNode, TType(EbtInt));
        else {
            // we should not get here, because earlier semantic checking should have prevented this path
            error(loc, ".length()", "unexpected use of .length()", "");
        }
    }

    if (length == 0)
        length = 1;

    return intermediate.addConstantUnion(length, loc);
}